

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O1

void __thiscall RandomizerWorld::load_item_sources(RandomizerWorld *this,bool lite_mode)

{
  bool bVar1;
  reference json;
  Json item_sources_json;
  iterator __end1;
  iterator __begin1;
  ItemSource *local_b0;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  iterator local_70;
  iterator local_50;
  
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  uStack_80 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[56993]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_a8,
             (uchar (*) [56993])
             "[\n    {\n        \"name\": \"Swamp Shrine (0F): chest in room to the right\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 0\n    },\n    {\n        \"name\": \"Swamp Shrine (0F): chest in carpet room\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 1\n    },\n    {\n        \"name\": \"Swamp Shrine (0F): chest in left hallway (accessed by falling from upstairs)\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 2\n    },\n    {\n        \"name\": \"Swamp Shrine (0F): falling chest after beating orc\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 3\n    },\n    {\n        \"name\": \"Swamp Shrine (0F): chest in room visible from second entrance\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 4\n    },\n    {\n        \"name\": \"Swamp Shrine (1F): lower chest in wooden bridges room\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 5\n    },\n    {\n        \"name\": \"Swamp Shrine (2F): upper chest in wooden bridges room\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 6\n    },\n    {\n        \"name\": \"Swamp Shrine (2F): chest on spiked floor room balcony\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 7\n    },\n    {\n        \"name\": \"Swamp Shrine (3F): chest in boss arena\",\n        \"type\": \"chest\",\n        \"nodeId\": \"swamp_shrine\",\n        \"chestId\": 8\n    },\n    {\n        \"name\": \"Mercator Dungeon (-1F): chest on elevated path near entrance\",\n        \"type\": \"chest\",\n        \"nodeId\": \"mercator_dungeon\",\n        \"hints\": [\n            \"hidden in the depths of Mercator\"\n        ],\n        \"chestId\": 9\n    },\n    {\n        \"name\": \"Mercator Dungeon (-1F): chest in Moralis\'s cell\",\n        \"type\": \"chest\",\n        \"nodeId\": \"mercator_dungeon\",\n        \"hints\": [\n            \"hidden in the depths of Mercator\"\n        ],\n        \"chestId\": 10\n    },\n    {\n        \"name\": \"Mercator Dungeon (-1F): left chest in unde..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_98,true,false);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::begin(&local_50,&local_a8);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::end(&local_70,&local_a8);
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_50,&local_70);
    if (bVar1) break;
    json = nlohmann::detail::
           iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ::operator*(&local_50);
    local_b0 = ItemSource::from_json(json,&this->super_World,!lite_mode);
    std::vector<ItemSource*,std::allocator<ItemSource*>>::emplace_back<ItemSource*>
              ((vector<ItemSource*,std::allocator<ItemSource*>> *)&this->_item_sources,&local_b0);
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_50);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_a8);
  return;
}

Assistant:

void RandomizerWorld::load_item_sources(bool lite_mode)
{
    Json item_sources_json = Json::parse(ITEM_SOURCES_JSON);
    for(const Json& source_json : item_sources_json)
    {
        _item_sources.emplace_back(ItemSource::from_json(source_json, *this, !lite_mode));
    }

    // The following chests are absent from the game on release or modded out of the game for the rando, and their IDs are therefore free:
    // 0x0E (14): Mercator Kitchen (variant?)
    // 0x1E (30): King Nole's Cave spiral staircase (variant with enemies?) ---> 29 is the one used in rando
    // 0x20 (32): Boulder chase hallway (variant with enemies?) ---> 31 is the one used in rando
    // 0x25 (37): Thieves Hideout entrance (variant with water)
    // 0x27 (39): Thieves Hideout entrance (waterless variant)
    // 0x28 (40): Thieves Hideout entrance (waterless variant)
    // 0x33 (51): Thieves Hideout second room (waterless variant)
    // 0x3D (61): Thieves Hideout reward room (Kayla cutscene variant)
    // 0x3E (62): Thieves Hideout reward room (Kayla cutscene variant)
    // 0x3F (63): Thieves Hideout reward room (Kayla cutscene variant)
    // 0x40 (64): Thieves Hideout reward room (Kayla cutscene variant)
    // 0x41 (65): Thieves Hideout reward room (Kayla cutscene variant)
    // 0xBB (187): Crypt (Larson. E room)
    // 0xBC (188): Crypt (Larson. E room)
    // 0xBD (189): Crypt (Larson. E room)
    // 0xBE (190): Crypt (Larson. E room)
    // 0xC3 (195): Map 712 / 0x2C8 ???
}